

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_Brep * ON_BrepBox(ON_3dPoint *box_corners,ON_Brep *pBrep)

{
  double dVar1;
  uint uVar2;
  ON_Brep *pOVar3;
  ON_3dPoint *pOVar4;
  ON_CurveArray *pOVar5;
  ON_BrepVertex *pOVar6;
  ON_BrepVertex *pOVar7;
  ON_LineCurve *pOVar8;
  ON_BrepEdge *edge;
  ON_BrepEdge *edge_00;
  ON_BrepEdge *edge_01;
  ON_BrepEdge *edge_02;
  ON_BrepVertex *pOVar9;
  ON_BrepVertex *pOVar10;
  ON_NurbsSurface *pS;
  ON_Surface **ppOVar11;
  double *pdVar12;
  double *pdVar13;
  ON_BrepFace *face_00;
  ON_BrepLoop *loop_00;
  double *pdVar14;
  ON_BrepTrim *pOVar15;
  TYPE TVar16;
  bool bVar17;
  double in_XMM1_Qa;
  int local_25c;
  ON_BrepTrim *trim3;
  ON_BrepTrim *trim2;
  ON_BrepTrim *trim1;
  ON_BrepTrim *trim0;
  ON_BrepLoop *loop;
  ON_BrepFace *face;
  ON_2dPoint p3;
  ON_2dPoint p2;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_Interval t;
  ON_Interval s;
  ON_BrepVertex *v3;
  ON_BrepVertex *v2;
  ON_BrepVertex *v1_3;
  ON_BrepVertex *v0_3;
  ON_BrepEdge *e3;
  ON_BrepEdge *e2;
  ON_BrepEdge *e1;
  ON_BrepEdge *e0;
  anon_struct_32_2_fe3f1d9c f [6];
  ON_BrepVertex *v1_2;
  ON_BrepVertex *v0_2;
  ON_BrepVertex *local_88;
  ON_BrepVertex *v1_1;
  ON_BrepVertex *v0_1;
  ON_BrepVertex *local_70;
  ON_BrepVertex *v1;
  ON_BrepVertex *v0;
  double local_58;
  double local_50;
  int local_34;
  int local_30;
  int c2i;
  int si;
  int fi;
  int ei;
  int vi;
  ON_Brep *brep;
  ON_Brep *pBrep_local;
  ON_3dPoint *box_corners_local;
  
  _ei = (ON_Brep *)0x0;
  if (box_corners == (ON_3dPoint *)0x0) {
    _ei = (ON_Brep *)0x0;
  }
  else {
    brep = pBrep;
    pBrep_local = (ON_Brep *)box_corners;
    if (pBrep == (ON_Brep *)0x0) {
      pOVar3 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(pOVar3);
      _ei = pOVar3;
    }
    else {
      ON_Brep::Destroy(pBrep);
      _ei = brep;
    }
    ON_SimpleArray<ON_Curve_*>::Reserve(&(_ei->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x18);
    ON_SimpleArray<ON_Curve_*>::Reserve(&(_ei->m_C3).super_ON_SimpleArray<ON_Curve_*>,0xc);
    ON_SimpleArray<ON_Surface_*>::Reserve(&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,6);
    ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,8);
    ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,0xc);
    ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&_ei->m_L,6);
    ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&_ei->m_T,0x18);
    ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&_ei->m_F,6);
    for (fi = 0; fi < 8; fi = fi + 1) {
      pOVar4 = (ON_3dPoint *)((long)&pBrep_local->super_ON_Geometry + (long)fi * 0x18);
      v0 = (ON_BrepVertex *)pOVar4->x;
      local_58 = pOVar4->y;
      local_50 = pOVar4->z;
      ON_Brep::NewVertex(_ei,*pOVar4,0.0);
    }
    for (si = 0; si < 4; si = si + 1) {
      v1 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,si);
      uVar2 = si + 1U;
      if ((int)(si + 1U) < 0) {
        uVar2 = si + 4;
      }
      local_70 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                            (si + 1) - (uVar2 & 0xfffffffc));
      pOVar5 = &_ei->m_C3;
      pOVar6 = (ON_BrepVertex *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                ((ON_LineCurve *)pOVar6,&(v1->super_ON_Point).point,
                 &(local_70->super_ON_Point).point);
      v0_1 = pOVar6;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar5->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&v0_1);
      ON_Brep::NewEdge(_ei,v1,local_70,si,(ON_Interval *)0x0,0.0);
    }
    for (si = 4; si < 8; si = si + 1) {
      v1_1 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,si);
      if (si == 7) {
        local_25c = 4;
      }
      else {
        local_25c = si + 1;
      }
      local_88 = ON_ClassArray<ON_BrepVertex>::operator[]
                           ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,local_25c);
      pOVar5 = &_ei->m_C3;
      pOVar6 = (ON_BrepVertex *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                ((ON_LineCurve *)pOVar6,&(v1_1->super_ON_Point).point,
                 &(local_88->super_ON_Point).point);
      v0_2 = pOVar6;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar5->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&v0_2);
      ON_Brep::NewEdge(_ei,v1_1,local_88,si,(ON_Interval *)0x0,0.0);
    }
    for (si = 8; si < 0xc; si = si + 1) {
      pOVar6 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,si + -8);
      pOVar7 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,si + -4);
      pOVar5 = &_ei->m_C3;
      pOVar8 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar8,&(pOVar6->super_ON_Point).point,&(pOVar7->super_ON_Point).point);
      f[5].bRev._8_8_ = pOVar8;
      ON_SimpleArray<ON_Curve_*>::Append
                (&pOVar5->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)(f[5].bRev + 2));
      ON_Brep::NewEdge(_ei,pOVar6,pOVar7,si,(ON_Interval *)0x0,0.0);
    }
    memcpy(&e0,&DAT_009e43f0,0xc0);
    for (c2i = 0; c2i < 6; c2i = c2i + 1) {
      edge = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[(long)c2i + -1].bRev[2]);
      edge_00 = ON_ClassArray<ON_BrepEdge>::operator[]
                          ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[(long)c2i + -1].bRev[3]);
      edge_01 = ON_ClassArray<ON_BrepEdge>::operator[]
                          ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[c2i].e[0]);
      edge_02 = ON_ClassArray<ON_BrepEdge>::operator[]
                          ((ON_ClassArray<ON_BrepEdge> *)&_ei->m_E,f[c2i].e[1]);
      pOVar6 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,edge->m_vi[f[c2i].e[2] != 0]);
      pOVar7 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,edge_00->m_vi[f[c2i].e[3] != 0])
      ;
      pOVar9 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                          edge_01->m_vi[f[c2i].bRev[0] != 0]);
      pOVar10 = ON_ClassArray<ON_BrepVertex>::operator[]
                          ((ON_ClassArray<ON_BrepVertex> *)&_ei->m_V,
                           edge_02->m_vi[f[c2i].bRev[1] != 0]);
      pOVar3 = _ei;
      pS = ON_NurbsSurfaceQuadrilateral
                     (&(pOVar6->super_ON_Point).point,&(pOVar7->super_ON_Point).point,
                      &(pOVar9->super_ON_Point).point,&(pOVar10->super_ON_Point).point,
                      (ON_NurbsSurface *)0x0);
      local_30 = ON_Brep::AddSurface(pOVar3,&pS->super_ON_Surface);
      ppOVar11 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,local_30);
      (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(*ppOVar11,0);
      ppOVar11 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(_ei->m_S).super_ON_SimpleArray<ON_Surface_*>,local_30);
      (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])();
      pdVar14 = t.m_t + 1;
      t.m_t[0] = in_XMM1_Qa;
      pdVar12 = ON_Interval::operator[]((ON_Interval *)pdVar14,0);
      dVar1 = *pdVar12;
      pdVar12 = &p0.y;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar12,0);
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&p1.y,dVar1,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar14,1);
      dVar1 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar12,0);
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&p2.y,dVar1,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar14,1);
      dVar1 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar12,1);
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&p3.y,dVar1,*pdVar13);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar14,0);
      dVar1 = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar12,1);
      in_XMM1_Qa = *pdVar13;
      ON_2dPoint::ON_2dPoint((ON_2dPoint *)&face,dVar1,in_XMM1_Qa);
      face_00 = ON_Brep::NewFace(_ei,local_30);
      loop_00 = ON_Brep::NewLoop(_ei,outer,face_00);
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar14,0);
      (loop_00->m_pbox).m_min.x = *pdVar13;
      pdVar13 = ON_Interval::operator[]((ON_Interval *)pdVar12,0);
      (loop_00->m_pbox).m_min.y = *pdVar13;
      (loop_00->m_pbox).m_min.z = 0.0;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)pdVar14,1);
      (loop_00->m_pbox).m_max.x = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)pdVar12,1);
      pOVar3 = _ei;
      (loop_00->m_pbox).m_max.y = *pdVar14;
      (loop_00->m_pbox).m_max.z = 0.0;
      pOVar8 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar8,(ON_2dPoint *)&p1.y,(ON_2dPoint *)&p2.y);
      local_34 = ON_Brep::AddTrimCurve(pOVar3,(ON_Curve *)pOVar8);
      pOVar15 = ON_Brep::NewTrim(_ei,edge,f[c2i].e[2] != 0,loop_00,local_34);
      pOVar3 = _ei;
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar17 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar17 + 2 + (uint)bVar17;
      pOVar15->m_iso = S_iso;
      pOVar8 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar8,(ON_2dPoint *)&p2.y,(ON_2dPoint *)&p3.y);
      local_34 = ON_Brep::AddTrimCurve(pOVar3,(ON_Curve *)pOVar8);
      pOVar15 = ON_Brep::NewTrim(_ei,edge_00,f[c2i].e[3] != 0,loop_00,local_34);
      pOVar3 = _ei;
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar17 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar17 + 2 + (uint)bVar17;
      pOVar15->m_iso = E_iso;
      pOVar8 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar8,(ON_2dPoint *)&p3.y,(ON_2dPoint *)&face);
      local_34 = ON_Brep::AddTrimCurve(pOVar3,(ON_Curve *)pOVar8);
      pOVar15 = ON_Brep::NewTrim(_ei,edge_01,f[c2i].bRev[0] != 0,loop_00,local_34);
      pOVar3 = _ei;
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      bVar17 = pOVar15->m_vi[0] == pOVar15->m_vi[1];
      pOVar15->m_type = bVar17 + 2 + (uint)bVar17;
      pOVar15->m_iso = N_iso;
      pOVar8 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(pOVar8,(ON_2dPoint *)&face,(ON_2dPoint *)&p1.y);
      local_34 = ON_Brep::AddTrimCurve(pOVar3,(ON_Curve *)pOVar8);
      pOVar15 = ON_Brep::NewTrim(_ei,edge_02,f[c2i].bRev[1] != 0,loop_00,local_34);
      pOVar15->m_tolerance[0] = 0.0;
      pOVar15->m_tolerance[1] = 0.0;
      TVar16 = singular;
      if (pOVar15->m_vi[0] != pOVar15->m_vi[1]) {
        TVar16 = mated;
      }
      pOVar15->m_type = TVar16;
      pOVar15->m_iso = W_iso;
    }
    uVar2 = (*(_ei->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(_ei,0);
    if ((uVar2 & 1) == 0) {
      if (brep == (ON_Brep *)0x0) {
        if (_ei != (ON_Brep *)0x0) {
          (*(_ei->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
        }
      }
      else {
        ON_Brep::Destroy(brep);
      }
      _ei = (ON_Brep *)0x0;
    }
  }
  return _ei;
}

Assistant:

ON_Brep* ON_BrepBox( const ON_3dPoint* box_corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;
  int vi, ei, fi, si, c2i;
  if (box_corners)
  {
    if ( pBrep ) {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    brep->m_C2.Reserve(24);
    brep->m_C3.Reserve(12);
    brep->m_S.Reserve(6);
    brep->m_V.Reserve(8);
    brep->m_E.Reserve(12);
    brep->m_L.Reserve(6);
    brep->m_T.Reserve(24);
    brep->m_F.Reserve(6);
    for ( vi = 0; vi < 8; vi++ )
    {
      brep->NewVertex( box_corners[vi], 0.0 );
    }
    for ( ei = 0; ei < 4; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 4; ei < 8; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==7?4:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    for ( ei = 8; ei < 12; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-8];
      ON_BrepVertex& v1 = brep->m_V[ei-4];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //           v7_______e6_____v6
    //            |\             |\
    //            | e7           | e5
    //            |  \ ______e4_____\ 
    //           e11  v4         |   v5
    //            |   |        e10   |
    //            |   |          |   |
    //            3---|---e2-----2   e9
    //            \   e8         \   |
    //             e3 |           e1 |
    //              \ |            \ |
    //               \v0_____e0_____\v1
    */

    struct {
      int e[4], bRev[4];
    } f[6] = {
      {{0, 9, 4, 8},  {false, false, true,  true}},
      {{1,10, 5, 9},  {false, false, true,  true}},
      {{2,11, 6,10},  {false, false, true,  true}},
      {{3, 8, 7,11},  {false, false, true,  true}},
      {{3, 2, 1, 0},  {true,  true,  true,  true}},
      {{4, 5, 6, 7},  {false, false, false, false}}
    };
    for ( fi = 0; fi < 6; fi++ )
    {
      ON_BrepEdge& e0 = brep->m_E[f[fi].e[0]];
      ON_BrepEdge& e1 = brep->m_E[f[fi].e[1]];
      ON_BrepEdge& e2 = brep->m_E[f[fi].e[2]];
      ON_BrepEdge& e3 = brep->m_E[f[fi].e[3]];
      ON_BrepVertex& v0 = brep->m_V[e0.m_vi[f[fi].bRev[0]?1:0]];
      ON_BrepVertex& v1 = brep->m_V[e1.m_vi[f[fi].bRev[1]?1:0]];
      ON_BrepVertex& v2 = brep->m_V[e2.m_vi[f[fi].bRev[2]?1:0]];
      ON_BrepVertex& v3 = brep->m_V[e3.m_vi[f[fi].bRev[3]?1:0]];

      si = brep->AddSurface( ON_NurbsSurfaceQuadrilateral( v0.point, v1.point, v2.point, v3.point ) );
      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0(s[0],t[0]);
      ON_2dPoint p1(s[1],t[0]);
      ON_2dPoint p2(s[1],t[1]);
      ON_2dPoint p3(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      loop.m_pbox.m_min.x = s[0];
      loop.m_pbox.m_min.y = t[0];
      loop.m_pbox.m_min.z = 0.0;

      loop.m_pbox.m_max.x = s[1];
      loop.m_pbox.m_max.y = t[1];
      loop.m_pbox.m_max.z = 0.0;

      // south side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
      ON_BrepTrim& trim0 = brep->NewTrim( e0, f[fi].bRev[0], loop, c2i );
      trim0.m_tolerance[0] = 0.0;
      trim0.m_tolerance[1] = 0.0;
      trim0.m_type = (trim0.m_vi[0] != trim0.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim0.m_iso = ON_Surface::S_iso;

      // east side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
      ON_BrepTrim& trim1 = brep->NewTrim( e1, f[fi].bRev[1], loop, c2i );
      trim1.m_tolerance[0] = 0.0;
      trim1.m_tolerance[1] = 0.0;
      trim1.m_type = (trim1.m_vi[0] != trim1.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim1.m_iso = ON_Surface::E_iso;

      // north side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
      ON_BrepTrim& trim2 = brep->NewTrim( e2, f[fi].bRev[2], loop, c2i );
      trim2.m_tolerance[0] = 0.0;
      trim2.m_tolerance[1] = 0.0;
      trim2.m_type = (trim2.m_vi[0] != trim2.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim2.m_iso = ON_Surface::N_iso;

      // west side of surface
      c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
      ON_BrepTrim& trim3 = brep->NewTrim( e3, f[fi].bRev[3], loop, c2i );
      trim3.m_tolerance[0] = 0.0;
      trim3.m_tolerance[1] = 0.0;
      trim3.m_type = (trim3.m_vi[0] != trim3.m_vi[1]) ? ON_BrepTrim::mated : ON_BrepTrim::singular;
      trim3.m_iso = ON_Surface::W_iso;
    }
    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}